

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  TValue *pTVar1;
  TValue TVar2;
  TRef *pTVar3;
  TValue TVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TRef TVar8;
  TRef TVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  TValue savetv [5];
  RecordIndex ix;
  TValue local_78;
  TValue local_70;
  uint local_48;
  uint local_44;
  
  puVar10 = J->base + topslot;
  uVar14 = baseslot;
  if (baseslot <= topslot) {
    do {
      if (J->base[uVar14] == 0) {
        sload(J,uVar14);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 <= topslot);
  }
  if ((((*puVar10 & 0x1f000000) == 0x4000000) || ((*puVar10 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar10[-1] & 0x1f000000) == 0x4000000 || ((puVar10[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar3 = J->base;
    for (puVar11 = puVar10; pTVar3 + baseslot <= puVar11; puVar11 = puVar11 + -1) {
      uVar14 = *puVar11;
      if ((uVar14 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar14 & 0x1f000000) == 0xe000000);
        TVar8 = lj_opt_fold(J);
        *puVar11 = TVar8;
      }
      else if ((uVar14 & 0x1f000000) != 0x4000000) break;
    }
    puVar11 = puVar11 + 1;
    TVar8 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x31);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
    TVar9 = lj_opt_fold(J);
    puVar12 = puVar11;
    TVar8 = TVar9;
    do {
      uVar14 = *puVar12;
      puVar12 = puVar12 + 1;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
      TVar8 = lj_opt_fold(J);
    } while (puVar12 <= puVar10);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar8 = lj_opt_fold(J);
    topslot = (BCReg)((ulong)((long)puVar11 - (long)J->base) >> 2);
    J->maxslot = topslot;
    if (puVar11 == pTVar3 + baseslot) {
      return TVar8;
    }
    J->maxslot = topslot - 1;
    *puVar11 = TVar8;
    local_70.u64 = (ulong)(J[-1].penalty + 0x2c) | 0xfffd800000000000;
  }
  else {
    J->maxslot = topslot - 1;
    local_70 = J->L->base[topslot];
    puVar11 = puVar10;
  }
  pTVar1 = J->L->base;
  uVar13 = (ulong)(topslot - 1);
  local_78 = pTVar1[uVar13];
  local_48 = puVar11[-1];
  local_44 = *puVar11;
  TVar4 = pTVar1[uVar13];
  TVar5 = (pTVar1 + uVar13)[1];
  TVar6 = pTVar1[uVar13 + 2];
  TVar7 = (pTVar1 + uVar13 + 2)[1];
  TVar2 = pTVar1[uVar13 + 4];
  rec_mm_arith(J,(RecordIndex *)&local_78.gcr,MM_concat);
  pTVar1 = J->L->base;
  pTVar1[uVar13 + 4] = TVar2;
  pTVar1[uVar13 + 2] = TVar6;
  (pTVar1 + uVar13 + 2)[1] = TVar7;
  pTVar1[uVar13] = TVar4;
  (pTVar1 + uVar13)[1] = TVar5;
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}